

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_46dcfc::cmStringSorter::ApplyFilter
          (string *__return_storage_ptr__,cmStringSorter *this,string *argument)

{
  string local_68;
  StringFilter local_48;
  StringFilter filter;
  StringFilter *__end2;
  StringFilter *__begin2;
  StringFilter (*__range2) [2];
  string *local_20;
  string *argument_local;
  cmStringSorter *this_local;
  string *result;
  
  __range2._7_1_ = 0;
  local_20 = argument;
  argument_local = (string *)this;
  this_local = (cmStringSorter *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)argument);
  filter = (StringFilter)&this->sortMethod;
  __end2 = this->filters;
  __begin2 = this->filters;
  for (; __end2 != (StringFilter *)filter; __end2 = __end2 + 1) {
    local_48 = *__end2;
    if (local_48 != (StringFilter)0x0) {
      (*local_48)(&local_68,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ApplyFilter(const std::string& argument)
  {
    std::string result = argument;
    for (auto filter : this->filters) {
      if (filter != nullptr) {
        result = filter(result);
      }
    }
    return result;
  }